

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::updateFtest(SPxSolverBase<double> *this)

{
  int iVar1;
  IdxSet *this_00;
  char *pcVar2;
  double *pdVar3;
  int *piVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int __c;
  long in_RDI;
  double dVar5;
  double dVar6;
  double dVar7;
  Real RVar8;
  int i_1;
  int j_1;
  double eps;
  int i;
  int j;
  double theeps;
  VectorBase<double> *ftest;
  IdxSet *idx;
  SPxSolverBase<double> *in_stack_ffffffffffffff68;
  SSVectorBase<double> *in_stack_ffffffffffffff70;
  SPxSolverBase<double> *local_80;
  double local_50;
  uint local_34;
  uint local_24;
  
  this_00 = UpdateVector<double>::idx((UpdateVector<double> *)0x245a48);
  IdxSet::clear((IdxSet *)(in_RDI + 0x828));
  dVar5 = entertol(in_stack_ffffffffffffff68);
  local_24 = IdxSet::size(this_00);
  iVar1 = extraout_EDX;
  local_80 = in_stack_ffffffffffffff68;
  while (local_24 = local_24 - 1, -1 < (int)local_24) {
    pcVar2 = IdxSet::index(this_00,(char *)(ulong)local_24,iVar1);
    if (((*(byte *)(in_RDI + 0x358) & 1) != 0) &&
       (pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff70,
                            (int)((ulong)local_80 >> 0x20)), *pdVar3 < -dVar5)) {
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff70,
                          (int)((ulong)local_80 >> 0x20));
      *(double *)(in_RDI + 0x350) = *pdVar3 + *(double *)(in_RDI + 0x350);
    }
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff70,
                        (int)((ulong)local_80 >> 0x20));
    dVar6 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff70,
                        (int)((ulong)local_80 >> 0x20));
    iVar1 = (int)((ulong)local_80 >> 0x20);
    if (dVar6 < *pdVar3 || dVar6 == *pdVar3) {
      pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_ffffffffffffff70,iVar1)
      ;
      local_50 = *pdVar3;
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff70,
                          (int)((ulong)local_80 >> 0x20));
      local_50 = local_50 - *pdVar3;
    }
    else {
      pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_ffffffffffffff70,iVar1)
      ;
      local_50 = *pdVar3;
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff70,
                          (int)((ulong)local_80 >> 0x20));
      local_50 = local_50 - *pdVar3;
    }
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff70,
                        (int)((ulong)local_80 >> 0x20));
    *pdVar3 = local_50;
    iVar1 = extraout_EDX_00;
    if (((*(byte *)(in_RDI + 0x898) & 1) == 0) ||
       (pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff70,
                            (int)((ulong)local_80 >> 0x20)), iVar1 = extraout_EDX_01,
       -dVar5 <= *pdVar3)) {
      if (((*(byte *)(in_RDI + 0x358) & 1) != 0) &&
         (pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff70,
                              (int)((ulong)local_80 >> 0x20)), iVar1 = extraout_EDX_05,
         *pdVar3 < -dVar5)) {
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff70,
                            (int)((ulong)local_80 >> 0x20));
        *(double *)(in_RDI + 0x350) = *(double *)(in_RDI + 0x350) - *pdVar3;
        iVar1 = extraout_EDX_06;
      }
    }
    else {
      if ((*(byte *)(in_RDI + 0x358) & 1) != 0) {
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff70,
                            (int)((ulong)local_80 >> 0x20));
        *(double *)(in_RDI + 0x350) = *(double *)(in_RDI + 0x350) - *pdVar3;
      }
      piVar4 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x868),(int)pcVar2);
      iVar1 = extraout_EDX_02;
      if (*piVar4 == 0) {
        DIdxSet::addIdx((DIdxSet *)in_stack_ffffffffffffff70,(int)((ulong)local_80 >> 0x20));
        piVar4 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x868),(int)pcVar2);
        *piVar4 = 1;
        iVar1 = extraout_EDX_03;
      }
      if ((*(byte *)(in_RDI + 0x89b) & 1) != 0) {
        DIdxSet::addIdx((DIdxSet *)in_stack_ffffffffffffff70,(int)((ulong)local_80 >> 0x20));
        iVar1 = extraout_EDX_04;
      }
    }
  }
  if (0 < *(int *)(in_RDI + 0x778)) {
    dVar6 = epsilon((SPxSolverBase<double> *)0x245dc5);
    for (local_34 = 0; iVar1 = SSVectorBase<double>::size((SSVectorBase<double> *)0x245dec),
        (int)local_34 < iVar1; local_34 = local_34 + 1) {
      dVar7 = SSVectorBase<double>::value(in_stack_ffffffffffffff70,(int)((ulong)local_80 >> 0x20));
      RVar8 = spxAbs<double>(dVar7);
      iVar1 = (int)((ulong)local_80 >> 0x20);
      if (dVar6 < RVar8) {
        pcVar2 = SSVectorBase<double>::index
                           (*(SSVectorBase<double> **)(in_RDI + 0x3b0),(char *)(ulong)local_34,__c);
        if (((*(byte *)(in_RDI + 0x358) & 1) != 0) &&
           (pdVar3 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff70,iVar1),
           *pdVar3 < -dVar5)) {
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff70,iVar1);
          *(double *)(in_RDI + 0x350) = *pdVar3 + *(double *)(in_RDI + 0x350);
        }
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff70,iVar1);
        dVar7 = *pdVar3;
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff70,iVar1);
        if (dVar7 < *pdVar3 || dVar7 == *pdVar3) {
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff70,iVar1);
          in_stack_ffffffffffffff70 = (SSVectorBase<double> *)*pdVar3;
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff70,iVar1);
          local_80 = (SPxSolverBase<double> *)((double)in_stack_ffffffffffffff70 - *pdVar3);
        }
        else {
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff70,iVar1);
          dVar7 = *pdVar3;
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff70,iVar1);
          local_80 = (SPxSolverBase<double> *)(dVar7 - *pdVar3);
        }
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff70,
                            (int)((ulong)local_80 >> 0x20));
        *pdVar3 = (double)local_80;
        if (((*(byte *)(in_RDI + 0x898) & 1) == 0) ||
           (pdVar3 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff70,
                                (int)((ulong)local_80 >> 0x20)), -dVar5 <= *pdVar3)) {
          if (((*(byte *)(in_RDI + 0x358) & 1) != 0) &&
             (pdVar3 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_ffffffffffffff70,
                                  (int)((ulong)local_80 >> 0x20)), *pdVar3 < -dVar5)) {
            pdVar3 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff70,
                                (int)((ulong)local_80 >> 0x20));
            *(double *)(in_RDI + 0x350) = *(double *)(in_RDI + 0x350) - *pdVar3;
          }
        }
        else {
          if ((*(byte *)(in_RDI + 0x358) & 1) != 0) {
            pdVar3 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff70,
                                (int)((ulong)local_80 >> 0x20));
            *(double *)(in_RDI + 0x350) = *(double *)(in_RDI + 0x350) - *pdVar3;
          }
          piVar4 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x868),(int)pcVar2);
          if (*piVar4 == 0) {
            DIdxSet::addIdx((DIdxSet *)in_stack_ffffffffffffff70,(int)((ulong)local_80 >> 0x20));
            piVar4 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x868),(int)pcVar2);
            *piVar4 = 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateFtest()
{
   const IdxSet& idx = theFvec->idx();
   VectorBase<R>& ftest = theCoTest;      // |== fTest()|
   assert(&ftest == &fTest());

   assert(type() == LEAVE);

   updateViols.clear();
   R theeps = entertol();

   for(int j = idx.size() - 1; j >= 0; --j)
   {
      int i = idx.index(j);

      if(m_pricingViolUpToDate && ftest[i] < -theeps)
         // violation was present before this iteration
         m_pricingViol += ftest[i];

      ftest[i] = ((*theFvec)[i] > theUBbound[i])
                 ? theUBbound[i] - (*theFvec)[i]
                 : (*theFvec)[i] - theLBbound[i];

      if(sparsePricingLeave && ftest[i] < -theeps)
      {
         assert(remainingRoundsLeave == 0);

         if(m_pricingViolUpToDate)
            m_pricingViol -= ftest[i];

         if(isInfeasible[i] == SPxPricer<R>::NOT_VIOLATED)
         {
            // this can cause problems - we cannot keep on adding indeces to infeasibilities,
            // because they are not deleted in hyper mode...
            //             if( !hyperPricingLeave )
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
         }

         if(hyperPricingLeave)
            updateViols.addIdx(i);
      }
      else if(m_pricingViolUpToDate && ftest[i] < -theeps)
         m_pricingViol -= ftest[i];
   }

   // if boundflips were performed, we need to update these indices as well
   if(boundflips > 0)
   {
      R eps = epsilon();

      for(int j = 0; j < solveVector3->size(); ++j)
      {
         if(spxAbs(solveVector3->value(j)) > eps)
         {
            int i = solveVector3->index(j);

            if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol += ftest[i];

            ftest[i] = ((*theFvec)[i] > theUBbound[i]) ? theUBbound[i] - (*theFvec)[i] :
                       (*theFvec)[i] - theLBbound[i];

            if(sparsePricingLeave && ftest[i] < -theeps)
            {
               assert(remainingRoundsLeave == 0);

               if(m_pricingViolUpToDate)
                  m_pricingViol -= ftest[i];

               if(!isInfeasible[i])
               {
                  infeasibilities.addIdx(i);
                  isInfeasible[i] = true;
               }
            }
            else if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol -= ftest[i];
         }
      }
   }
}